

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O3

HRESULT CreateParserState(LPCSTR fileContents,size_t fileLength,
                         JsFinalizeCallback fileContentsFinalizeCallback,LPCWSTR fullPath)

{
  char *_Dst;
  bool bVar1;
  JsErrorCode JVar2;
  int iVar3;
  BOOL BVar4;
  HRESULT HVar5;
  PAL_FILE *pPVar6;
  LPCWSTR pWVar7;
  HANDLE hFile;
  JsFinalizeCallback fileContentsFinalizeCallback_00;
  size_t extraout_RDX;
  LPCSTR fileContents_00;
  char16_t *format;
  char *fileName;
  char *pcVar8;
  ulong uVar9;
  JsValueRef pvStack_b8;
  size_t sStack_b0;
  char *pcStack_a8;
  JsRuntimeHandle pvStack_a0;
  JsContextRef pvStack_98;
  JsContextRef pvStack_90;
  undefined8 uStack_88;
  char *pcStack_80;
  LPDWORD pDStack_78;
  HANDLE pVStack_70;
  ulong uStack_68;
  code *pcStack_60;
  JsValueRef local_50;
  JsValueRef parserStateBuffer;
  BYTE *buffer;
  DWORD local_38;
  uint uStack_34;
  char scratch [3];
  DWORD written;
  uint bufferSize;
  
  HVar5 = 0;
  local_50 = (JsValueRef)0x0;
  parserStateBuffer = (JsValueRef)0x0;
  uStack_34 = 0;
  pcStack_60 = (code *)0x108cd0;
  GetParserStateBuffer(fileContents,fileContentsFinalizeCallback,&local_50);
  pcStack_60 = (code *)0x108ce6;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetArrayBufferStorage)
                    (local_50,(BYTE **)&parserStateBuffer,&stack0xffffffffffffffcc);
  if (JVar2 == JsNoError) {
    pcStack_60 = (code *)0x108d32;
    hFile = GetFileHandle(fullPath);
    HVar5 = -0x7fffbffb;
    if (1 < (long)hFile + 1U) {
      if (uStack_34 != 0) {
        _Dst = (char *)((long)&buffer + 5);
        uVar9 = 0;
        do {
          local_38 = 0;
          pcVar8 = (char *)(ulong)*(byte *)((long)parserStateBuffer + uVar9);
          fileContents_00 = (LPCSTR)0x3;
          fileContentsFinalizeCallback_00 = (JsFinalizeCallback)0x156b8b;
          pcStack_60 = (code *)0x108d87;
          fileName = _Dst;
          iVar3 = _snprintf_unsafe(_Dst,3,3,"%02X");
          if (iVar3 != 2) {
            pcStack_60 = CreateParserStateAndRunScript;
            CreateParserState();
            uStack_88 = 0x80004005;
            pvStack_a0 = (JsRuntimeHandle)0x0;
            pvStack_98 = (JsContextRef)0x0;
            pvStack_90 = (JsContextRef)0x0;
            sStack_b0 = extraout_RDX;
            pcStack_80 = _Dst;
            pDStack_78 = &local_38;
            pVStack_70 = hFile;
            uStack_68 = uVar9;
            pcStack_60 = (code *)&stack0xfffffffffffffff8;
            GetParserStateBuffer(fileContents_00,(JsFinalizeCallback)0x0,&pvStack_b8);
            HVar5 = CreateRuntime(&pvStack_a0);
            if (-1 < HVar5) {
              chRuntime = pvStack_a0;
              pcStack_a8 = pcVar8;
              JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(pvStack_a0,&pvStack_98)
              ;
              if (JVar2 == JsNoError) {
                JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetCurrentContext)(&pvStack_90);
                if (JVar2 == JsNoError) {
                  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(pvStack_98);
                  if (JVar2 == JsNoError) {
                    HVar5 = -0x7fffbffb;
                    bVar1 = WScriptJsrt::Initialize();
                    if (bVar1) {
                      HVar5 = RunScript(fileName,fileContents_00,sStack_b0,
                                        fileContentsFinalizeCallback_00,(JsValueRef)0x0,pcStack_a8,
                                        pvStack_b8);
                      goto LAB_00108f32;
                    }
                    goto LAB_00108f28;
                  }
                  pPVar6 = PAL_get_stderr(0);
                  pWVar7 = Helpers::JsErrorCodeToString(JVar2);
                  format = 
                  L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                  ;
                }
                else {
                  pPVar6 = PAL_get_stderr(0);
                  pWVar7 = Helpers::JsErrorCodeToString(JVar2);
                  format = 
                  L"ERROR: ChakraRTInterface::JsGetCurrentContext(&current) failed. JsErrorCode=0x%x (%s)\n"
                  ;
                }
              }
              else {
                pPVar6 = PAL_get_stderr(0);
                pWVar7 = Helpers::JsErrorCodeToString(JVar2);
                format = 
                L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
                ;
              }
              PAL_fwprintf(pPVar6,format,(ulong)JVar2,pWVar7);
              HVar5 = 0;
              pPVar6 = PAL_get_stderr(0);
              PAL_fflush(pPVar6);
            }
LAB_00108f28:
            if (fileContentsFinalizeCallback_00 != (JsFinalizeCallback)0x0) {
              (*fileContentsFinalizeCallback_00)(fileContents_00);
            }
LAB_00108f32:
            if (pvStack_90 != (JsContextRef)0x0) {
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(pvStack_90);
            }
            if (pvStack_a0 != (JsRuntimeHandle)0x0) {
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(pvStack_a0);
            }
            return HVar5;
          }
          pcStack_60 = (code *)0x108da6;
          BVar4 = WriteFile(hFile,_Dst,2,&local_38,(LPOVERLAPPED)0x0);
          if (BVar4 == 0) goto LAB_00108df9;
          if (uVar9 < uStack_34 - 1 && (~(uint)uVar9 & 0x1f) == 0) {
            pcStack_60 = (code *)0x108de2;
            BVar4 = WriteFile(hFile,"\n",1,&local_38,(LPOVERLAPPED)0x0);
            if (BVar4 == 0) goto LAB_00108df9;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uStack_34);
      }
      HVar5 = 0;
    }
LAB_00108df9:
    if (hFile != (HANDLE)0x0) {
      pcStack_60 = (code *)0x108e06;
      CloseHandle(hFile);
    }
  }
  else {
    pcStack_60 = (code *)0x108cf4;
    pPVar6 = PAL_get_stderr(0);
    pcStack_60 = (code *)0x108cff;
    pWVar7 = Helpers::JsErrorCodeToString(JVar2);
    pcStack_60 = (code *)0x108d16;
    PAL_fwprintf(pPVar6,
                 L"ERROR: ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar2,pWVar7);
    pcStack_60 = (code *)0x108d1d;
    pPVar6 = PAL_get_stderr(0);
    pcStack_60 = (code *)0x108d25;
    PAL_fflush(pPVar6);
  }
  return HVar5;
}

Assistant:

HRESULT CreateParserState(LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, LPCWSTR fullPath)
{
    HRESULT hr = S_OK;
    HANDLE fileHandle = nullptr;
    JsValueRef parserStateBuffer = nullptr;
    BYTE *buffer = nullptr;
    unsigned int bufferSize = 0;

    IfFailedGoLabel(GetParserStateBuffer(fileContents, fileContentsFinalizeCallback, &parserStateBuffer), Error);
    IfJsErrorFailLog(ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize));

    fileHandle = GetFileHandle(fullPath);
    IfFalseGo(fileHandle != INVALID_HANDLE_VALUE && fileHandle != nullptr);

    for (unsigned int i = 0; i < bufferSize; i++)
    {
        const unsigned int BYTES_PER_LINE = 32;
        DWORD written = 0;
        char scratch[3];
        auto scratchLen = sizeof(scratch);
        int num = _snprintf_s(scratch, scratchLen, _countof(scratch), "%02X", buffer[i]);
        Assert(num == 2);
        IfFalseGo(WriteFile(fileHandle, scratch, (DWORD)(scratchLen - 1), &written, nullptr));

        // Add line breaks so this block can be readable
        if (i % BYTES_PER_LINE == (BYTES_PER_LINE - 1) && i < bufferSize - 1)
        {
            IfFalseGo(WriteFile(fileHandle, "\n", 1, &written, nullptr));
        }
    }

Error:
    if (fileHandle != nullptr)
    {
        CloseHandle(fileHandle);
    }
    return hr;
}